

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_copy(_glist *x)

{
  _rtext *x_00;
  _binbuf *p_Var1;
  int bufsize;
  char *buf;
  uint local_24;
  char *local_20;
  
  if (x->gl_editor != (t_editor *)0x0) {
    if (x->gl_editor->e_selection != (t_selection *)0x0) {
      binbuf_free(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
      p_Var1 = canvas_docopy(x);
      *(_binbuf **)(pd_maininstance.pd_gui)->i_editor = p_Var1;
    }
    x_00 = x->gl_editor->e_textedfor;
    if (x_00 != (_rtext *)0x0) {
      rtext_getseltext(x_00,&local_20,(int *)&local_24);
      pdgui_vmess("clipboard","r","clear");
      pdgui_vmess("clipboard","rp","append",(ulong)local_24,local_20);
    }
  }
  return;
}

Assistant:

static void canvas_copy(t_canvas *x)
{
    if (!x->gl_editor)
        return;
    if (x->gl_editor->e_selection)
    {
        binbuf_free(EDITOR->copy_binbuf);
        EDITOR->copy_binbuf = canvas_docopy(x);
    }
    if (x->gl_editor->e_textedfor)
    {
        char *buf;
        int bufsize;
        rtext_getseltext(x->gl_editor->e_textedfor, &buf, &bufsize);
        pdgui_vmess("clipboard", "r", "clear");
        pdgui_vmess("clipboard", "rp",  "append", bufsize, buf);
    }
}